

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgcf(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *array,char *nullarray,int *anynul,int *status)

{
  LONGLONG in_RCX;
  undefined4 in_EDX;
  fitsfile *unaff_RBX;
  LONGLONG unaff_RBP;
  int in_ESI;
  LONGLONG in_RDI;
  double *in_R8;
  LONGLONG unaff_R14;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  fitsfile *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000020;
  char cnulval [2];
  double nulval;
  int in_stack_000002fc;
  LONGLONG in_stack_00000300;
  LONGLONG in_stack_00000308;
  LONGLONG in_stack_00000310;
  int in_stack_0000031c;
  fitsfile *in_stack_00000320;
  char *in_stack_00000350;
  char **in_stack_00000358;
  char *in_stack_00000360;
  int *in_stack_00000368;
  int *in_stack_00000370;
  int in_stack_000071e4;
  LONGLONG in_stack_000071e8;
  LONGLONG in_stack_000071f0;
  LONGLONG in_stack_000071f8;
  int in_stack_00007204;
  fitsfile *in_stack_00007208;
  long in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  undefined4 in_stack_00007248;
  float in_stack_0000724c;
  undefined4 in_stack_00007250;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  undefined4 in_stack_00007260;
  int in_stack_00007264;
  fitsfile *in_stack_00007268;
  undefined4 in_stack_00007270;
  int in_stack_00007274;
  fitsfile *in_stack_00007278;
  int in_stack_000072a0;
  char in_stack_000072a8;
  undefined1 in_stack_000072a9;
  undefined2 in_stack_000072aa;
  undefined4 in_stack_000072ac;
  int in_stack_000072b0;
  undefined4 in_stack_000072b4;
  uchar in_stack_000072b8;
  undefined1 in_stack_000072b9;
  undefined2 in_stack_000072ba;
  undefined4 in_stack_000072bc;
  int in_stack_000072c0;
  undefined4 in_stack_000072c4;
  double *in_stack_000072c8;
  int *in_stack_000072d0;
  int *in_stack_000072d8;
  int *in_stack_000072e0;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar1;
  
  if (*in_stack_00000020 < 1) {
    if (in_ESI == 1) {
      ffgcx(in_stack_00000008,unaff_retaddr_00,unaff_RBP,unaff_R14,(LONGLONG)unaff_RBX,
            (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_00000020)
      ;
    }
    else if (in_ESI == 0xb) {
      ffgclb(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
             CONCAT44(in_stack_00007254,in_stack_00007250),
             CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
             in_stack_000072b8,(uchar *)CONCAT44(in_stack_000072c4,in_stack_000072c0),
             (char *)in_stack_000072c8,in_stack_000072d0,in_stack_000072d8);
    }
    else if (in_ESI == 0xc) {
      ffgclsb(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
              in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
              in_stack_000072a8,(char *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
              (char *)CONCAT44(in_stack_000072bc,
                               CONCAT22(in_stack_000072ba,
                                        CONCAT11(in_stack_000072b9,in_stack_000072b8))),
              (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
    }
    else if (in_ESI == 0x14) {
      ffgclui(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
              in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
              CONCAT11(in_stack_000072a9,in_stack_000072a8),
              (unsigned_short *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
              (char *)CONCAT44(in_stack_000072bc,
                               CONCAT22(in_stack_000072ba,
                                        CONCAT11(in_stack_000072b9,in_stack_000072b8))),
              (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
    }
    else if (in_ESI == 0x15) {
      ffgcli(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
             CONCAT44(in_stack_00007254,in_stack_00007250),
             CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
             CONCAT11(in_stack_000072b9,in_stack_000072b8),
             (short *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
             in_stack_000072d0,in_stack_000072d8);
    }
    else if (in_ESI == 0x1e) {
      ffgcluk(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
              in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
              CONCAT22(in_stack_000072aa,CONCAT11(in_stack_000072a9,in_stack_000072a8)),
              (uint *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
              (char *)CONCAT44(in_stack_000072bc,
                               CONCAT22(in_stack_000072ba,
                                        CONCAT11(in_stack_000072b9,in_stack_000072b8))),
              (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
    }
    else if (in_ESI == 0x1f) {
      ffgclk(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
             CONCAT44(in_stack_00007254,in_stack_00007250),
             CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
             CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8)),
             (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
             in_stack_000072d0,in_stack_000072d8);
    }
    else if (in_ESI == 0x28) {
      ffgcluj(in_stack_00007258,in_stack_00007254,CONCAT44(in_stack_0000724c,in_stack_00007248),
              in_stack_00007240,in_stack_00007238,in_stack_00007230,in_stack_000072a0,
              CONCAT44(in_stack_000072ac,
                       CONCAT22(in_stack_000072aa,CONCAT11(in_stack_000072a9,in_stack_000072a8))),
              (unsigned_long *)CONCAT44(in_stack_000072b4,in_stack_000072b0),
              (char *)CONCAT44(in_stack_000072bc,
                               CONCAT22(in_stack_000072ba,
                                        CONCAT11(in_stack_000072b9,in_stack_000072b8))),
              (int *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(int *)in_stack_000072c8);
    }
    else if (in_ESI == 0x29) {
      ffgclj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
             CONCAT44(in_stack_00007254,in_stack_00007250),
             CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
             CONCAT44(in_stack_000072bc,
                      CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
             (long *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
             in_stack_000072d0,in_stack_000072d8);
    }
    else if (in_ESI == 0x50) {
      ffgclujj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
               CONCAT44(in_stack_00007254,in_stack_00007250),
               CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
               CONCAT44(in_stack_000072bc,
                        CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
               (ULONGLONG *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
               in_stack_000072d0,in_stack_000072d8);
    }
    else if (in_ESI == 0x51) {
      ffgcljj(in_stack_00007268,in_stack_00007264,(LONGLONG)in_stack_00007258,
              CONCAT44(in_stack_00007254,in_stack_00007250),
              CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_00007240,in_stack_000072b0,
              CONCAT44(in_stack_000072bc,
                       CONCAT22(in_stack_000072ba,CONCAT11(in_stack_000072b9,in_stack_000072b8))),
              (LONGLONG *)CONCAT44(in_stack_000072c4,in_stack_000072c0),(char *)in_stack_000072c8,
              in_stack_000072d0,in_stack_000072d8);
    }
    else if (in_ESI == 0x2a) {
      ffgcle(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
             CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
             CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,in_stack_0000724c,
             (float *)in_stack_000072c8,(char *)in_stack_000072d0,in_stack_000072d8,
             in_stack_000072e0);
    }
    else if (in_ESI == 0x52) {
      ffgcld(in_stack_00007278,in_stack_00007274,(LONGLONG)in_stack_00007268,
             CONCAT44(in_stack_00007264,in_stack_00007260),(LONGLONG)in_stack_00007258,
             CONCAT44(in_stack_00007254,in_stack_00007250),in_stack_000072c0,
             (double)CONCAT44(in_stack_0000724c,in_stack_00007248),in_stack_000072c8,
             (char *)in_stack_000072d0,in_stack_000072d8,in_stack_000072e0);
    }
    else if (in_ESI == 0x53) {
      ffgcfc(unaff_RBX,in_stack_ffffffffffffffe4,in_RDI,CONCAT44(0x53,in_EDX),in_RCX,(float *)in_R8,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),&in_stack_00000008->HDUposition,
             in_stack_00000010);
    }
    else if (in_ESI == 0xa3) {
      ffgcfm(unaff_RBX,in_stack_ffffffffffffffe4,in_RDI,CONCAT44(0xa3,in_EDX),in_RCX,in_R8,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),&in_stack_00000008->HDUposition,
             in_stack_00000010);
    }
    else if (in_ESI == 0xe) {
      ffgcll(in_stack_00007208,in_stack_00007204,in_stack_000071f8,in_stack_000071f0,
             in_stack_000071e8,in_stack_000071e4,(char)in_stack_00007250,(char *)in_stack_00007258,
             (char *)CONCAT44(in_stack_00007264,in_stack_00007260),&in_stack_00007268->HDUposition,
             (int *)CONCAT44(in_stack_00007274,in_stack_00007270));
    }
    else if (in_ESI == 0x10) {
      ffgcls(in_stack_00000320,in_stack_0000031c,in_stack_00000310,in_stack_00000308,
             in_stack_00000300,in_stack_000002fc,in_stack_00000350,in_stack_00000358,
             in_stack_00000360,in_stack_00000368,in_stack_00000370);
    }
    else {
      *in_stack_00000020 = 0x19a;
    }
    iVar1 = *in_stack_00000020;
  }
  else {
    iVar1 = *in_stack_00000020;
  }
  return iVar1;
}

Assistant:

int ffgcf(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            int  colnum,      /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of null value flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a table column. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  ANYNUL is returned with a value of true if any pixels are undefined.
*/
{
    double nulval = 0.;
    char cnulval[2];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffgcx(fptr, colnum, firstrow, firstelem, nelem, (char *) array, status);
    }
    else if (datatype == TBYTE)
    {
       ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (unsigned char )
              nulval, (unsigned char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
       ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (signed char )
              nulval, (signed char *) array, nullarray, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 2,
               (unsigned short ) nulval,
               (unsigned short *) array, nullarray, anynul, status);
    }
    else if (datatype == TSHORT)
    {
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (short )
              nulval, (short *) array, nullarray, anynul, status);
    }
    else if (datatype == TUINT)
    {
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 2,
         (unsigned int ) nulval, (unsigned int *) array, nullarray, anynul,
         status);
    }
    else if (datatype == TINT)
    {
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (int )
            nulval, (int *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONG)
    {
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 2,
               (unsigned long ) nulval, 
               (unsigned long *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONG)
    {
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (long )
              nulval, (long *) array, nullarray, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (ULONGLONG )
              nulval, (ULONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (LONGLONG )
              nulval, (LONGLONG *) array, nullarray, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 2, (float )
               nulval,(float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 2, 
              nulval, (double *) array, nullarray, anynul, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffgcfc(fptr, colnum, firstrow, firstelem, nelem,
           (float *) array, nullarray, anynul, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffgcfm(fptr, colnum, firstrow, firstelem, nelem, 
           (double *) array, nullarray, anynul, status);
    }

    else if (datatype == TLOGICAL)
    {
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 2, (char ) nulval,
          (char *) array, nullarray, anynul, status);
    }
    else if (datatype == TSTRING)
    {
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 2, 
             cnulval, (char **) array, nullarray, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}